

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakelibraryinfo.cpp
# Opt level: O0

void QMakeLibraryInfo::reload(void)

{
  bool bVar1;
  QMakeLibrarySettings *in_stack_00000010;
  
  QLibraryInfoPrivate::reload();
  bVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qmake_library_settings>_>
          ::exists((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qmake_library_settings>_>
                    *)0x122256);
  if (bVar1) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qmake_library_settings>_>::
    operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qmake_library_settings>_>
                *)0x122268);
    QMakeLibrarySettings::load(in_stack_00000010);
  }
  return;
}

Assistant:

void QMakeLibraryInfo::reload()
{
    QLibraryInfoPrivate::reload();
    if (qmake_library_settings.exists())
        qmake_library_settings->load();
}